

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O2

void __thiscall
gtest_suite_UnsignedToString_::Zero<unsigned_int>::TestBody(Zero<unsigned_int> *this)

{
  not_null<std::array<char,_10UL>_*> nVar1;
  char *pcVar2;
  AssertHelper AStack_58;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  not_null<std::array<char,_10UL>_*> local_20;
  base10storage<TypeParam>_conflict out;
  
  local_20.ptr_ = &out;
  pstore::gsl::not_null<std::array<char,_10UL>_*>::ensure_invariant(&local_20);
  nVar1.ptr_ = local_20.ptr_;
  pcVar2 = (local_20.ptr_)->_M_elems;
  (local_20.ptr_)->_M_elems[9] = '0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar2 + 9,nVar1.ptr_ + 1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&gtest_ar,"(std::string{x.first, x.second})","\"0\"",&local_40,
             (char (*) [2])0x1c902f);
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_40._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST_P (UnsignedToString, Zero) {
    using namespace pstore::exchange::export_ns::details;
    base10storage<TypeParam> out;
    std::pair<char const *, char const *> const x = to_characters (TypeParam{0}, &out);
    EXPECT_EQ ((std::string{x.first, x.second}), "0");
}